

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 uVar1;
  byte bVar2;
  undefined1 uVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  undefined8 uVar7;
  long lVar8;
  uint in_EDI;
  bool bVar9;
  thread worker;
  bool isInitialized;
  bool isNotLoaded_1;
  bool isNotLoaded;
  void *gl_context;
  SDL_Window *window;
  SDL_WindowFlags window_flags;
  char *windowTitle;
  int windowY;
  int windowX;
  int playbackId;
  int captureId;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  undefined7 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb9f;
  string *in_stack_fffffffffffffba0;
  _Any_data *this;
  undefined7 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbaf;
  undefined1 in_stack_fffffffffffffbb8;
  byte bVar10;
  undefined1 in_stack_fffffffffffffbba;
  byte bVar11;
  undefined1 in_stack_fffffffffffffbbc;
  byte bVar12;
  undefined1 in_stack_fffffffffffffbc0;
  byte bVar13;
  undefined1 in_stack_fffffffffffffbc2;
  byte bVar14;
  undefined1 in_stack_fffffffffffffbc4;
  byte bVar15;
  key_type *in_stack_fffffffffffffbd8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffbe0;
  FILE *__stream;
  int local_3ec;
  int local_3bc;
  string local_360 [32];
  string local_340 [38];
  byte local_31a;
  byte local_319;
  string local_318 [32];
  string local_2f8 [38];
  byte local_2d2;
  byte local_2d1;
  string local_2d0 [32];
  string local_2b0 [38];
  byte local_28a;
  byte local_289;
  string local_288 [32];
  string local_268 [37];
  byte local_243;
  byte local_242;
  byte local_241;
  string local_240 [32];
  string local_220 [3];
  undefined1 in_stack_fffffffffffffde3;
  float in_stack_fffffffffffffde4;
  string *in_stack_fffffffffffffde8;
  string local_1f8 [32];
  string local_1d8 [38];
  byte local_1b2;
  byte local_1b1;
  string local_1b0 [32];
  string local_190 [38];
  byte local_16a;
  byte local_169;
  string local_168 [32];
  string local_148 [39];
  byte local_121;
  void *local_120;
  _Any_data local_118;
  char *local_108;
  undefined4 local_100;
  undefined4 local_fc;
  undefined4 local_f8;
  byte local_f3;
  byte local_f2;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  int local_a8;
  byte local_a3;
  byte local_a2;
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [36];
  int local_44;
  undefined1 local_40 [60];
  int local_4;
  
  local_4 = 0;
  parseCmdArguments_abi_cxx11_((int)local_40,(char **)(ulong)in_EDI);
  std::allocator<char>::allocator();
  local_a2 = 0;
  local_a3 = 0;
  std::__cxx11::string::string(local_68,"c",&local_69);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    local_a2 = 1;
    std::__cxx11::string::string(local_a0,"c",&local_a1);
    local_a3 = 1;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    local_3bc = std::__cxx11::stoi(in_stack_fffffffffffffba0,
                                   (size_t *)
                                   CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98),0);
  }
  else {
    local_3bc = 0;
  }
  if ((local_a3 & 1) != 0) {
    std::__cxx11::string::~string(local_a0);
  }
  if ((local_a2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_44 = local_3bc;
  std::allocator<char>::allocator();
  local_f2 = 0;
  local_f3 = 0;
  std::__cxx11::string::string(local_c8,"p",&local_c9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    local_f2 = 1;
    std::__cxx11::string::string(local_f0,"p",&local_f1);
    local_f3 = 1;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    local_3ec = std::__cxx11::stoi(in_stack_fffffffffffffba0,
                                   (size_t *)
                                   CONCAT17(in_stack_fffffffffffffb9f,in_stack_fffffffffffffb98),0);
  }
  else {
    local_3ec = 0;
  }
  if ((local_f3 & 1) != 0) {
    std::__cxx11::string::~string(local_f0);
  }
  if ((local_f2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  }
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  local_a8 = local_3ec;
  iVar5 = SDL_Init(0x20);
  if (iVar5 == 0) {
    ImGui_PreInit();
    local_fc = 400;
    local_100 = 600;
    local_108 = "Waver";
    local_118._12_4_ = 0x2022;
    local_118._M_unused._0_8_ =
         (undefined8)SDL_CreateWindow("Waver",0x2fff0000,0x2fff0000,400,600,0x2022);
    local_120 = (void *)SDL_GL_CreateContext(local_118._M_unused._M_object);
    SDL_GL_MakeCurrent(local_118._M_unused._M_object,local_120);
    SDL_GL_SetSwapInterval(1);
    ImGui_Init((SDL_Window *)local_118._M_unused._0_8_,local_120);
    lVar8 = ImGui::GetIO();
    *(undefined8 *)(lVar8 + 0x18) = 0;
    local_121 = 1;
    local_169 = 0;
    local_16a = 0;
    getBinaryPath_abi_cxx11_();
    local_169 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                   (char *)in_stack_fffffffffffffba0);
    local_16a = 1;
    uVar1 = ImGui_tryLoadFont(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                              (bool)in_stack_fffffffffffffde3);
    bVar2 = uVar1 ^ 0xff;
    local_121 = bVar2 & 1;
    if ((local_16a & 1) != 0) {
      std::__cxx11::string::~string(local_148);
    }
    if ((local_169 & 1) != 0) {
      std::__cxx11::string::~string(local_168);
    }
    local_1b1 = 0;
    local_1b2 = 0;
    bVar15 = 0;
    if ((local_121 & 1) != 0) {
      getBinaryPath_abi_cxx11_();
      local_1b1 = 1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                     (char *)in_stack_fffffffffffffba0);
      local_1b2 = 1;
      in_stack_fffffffffffffbc4 =
           ImGui_tryLoadFont(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                             (bool)in_stack_fffffffffffffde3);
      bVar15 = in_stack_fffffffffffffbc4 ^ 0xff;
    }
    local_121 = bVar15 & 1;
    if ((local_1b2 & 1) != 0) {
      std::__cxx11::string::~string(local_190);
    }
    if ((local_1b1 & 1) != 0) {
      std::__cxx11::string::~string(local_1b0);
    }
    bVar9 = (local_121 & 1) != 0;
    bVar14 = 0;
    if (bVar9) {
      getBinaryPath_abi_cxx11_();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                     (char *)in_stack_fffffffffffffba0);
      in_stack_fffffffffffffbc2 =
           ImGui_tryLoadFont(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                             (bool)in_stack_fffffffffffffde3);
      bVar14 = in_stack_fffffffffffffbc2 ^ 0xff;
    }
    local_121 = bVar14 & 1;
    if (bVar9) {
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::string::~string(local_1f8);
    }
    local_241 = 0;
    local_242 = 0;
    bVar13 = 0;
    if ((local_121 & 1) != 0) {
      getBinaryPath_abi_cxx11_();
      local_241 = 1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                     (char *)in_stack_fffffffffffffba0);
      local_242 = 1;
      in_stack_fffffffffffffbc0 =
           ImGui_tryLoadFont(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                             (bool)in_stack_fffffffffffffde3);
      bVar13 = in_stack_fffffffffffffbc0 ^ 0xff;
    }
    local_121 = bVar13 & 1;
    if ((local_242 & 1) != 0) {
      std::__cxx11::string::~string(local_220);
    }
    if ((local_241 & 1) != 0) {
      std::__cxx11::string::~string(local_240);
    }
    local_243 = 1;
    local_289 = 0;
    local_28a = 0;
    getBinaryPath_abi_cxx11_();
    local_289 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                   (char *)in_stack_fffffffffffffba0);
    local_28a = 1;
    uVar3 = ImGui_tryLoadFont(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                              (bool)in_stack_fffffffffffffde3);
    bVar4 = uVar3 ^ 0xff;
    local_243 = bVar4 & 1;
    if ((local_28a & 1) != 0) {
      std::__cxx11::string::~string(local_268);
    }
    if ((local_289 & 1) != 0) {
      std::__cxx11::string::~string(local_288);
    }
    local_2d1 = 0;
    local_2d2 = 0;
    bVar12 = 0;
    if ((local_243 & 1) != 0) {
      getBinaryPath_abi_cxx11_();
      local_2d1 = 1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                     (char *)in_stack_fffffffffffffba0);
      local_2d2 = 1;
      in_stack_fffffffffffffbbc =
           ImGui_tryLoadFont(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                             (bool)in_stack_fffffffffffffde3);
      bVar12 = in_stack_fffffffffffffbbc ^ 0xff;
    }
    local_243 = bVar12 & 1;
    if ((local_2d2 & 1) != 0) {
      std::__cxx11::string::~string(local_2b0);
    }
    if ((local_2d1 & 1) != 0) {
      std::__cxx11::string::~string(local_2d0);
    }
    local_319 = 0;
    local_31a = 0;
    bVar11 = 0;
    if ((local_243 & 1) != 0) {
      getBinaryPath_abi_cxx11_();
      local_319 = 1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                     (char *)in_stack_fffffffffffffba0);
      local_31a = 1;
      in_stack_fffffffffffffbba =
           ImGui_tryLoadFont(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                             (bool)in_stack_fffffffffffffde3);
      bVar11 = in_stack_fffffffffffffbba ^ 0xff;
    }
    local_243 = bVar11 & 1;
    if ((local_31a & 1) != 0) {
      std::__cxx11::string::~string(local_2f8);
    }
    if ((local_319 & 1) != 0) {
      std::__cxx11::string::~string(local_318);
    }
    bVar9 = (local_243 & 1) != 0;
    bVar10 = 0;
    if (bVar9) {
      getBinaryPath_abi_cxx11_();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                     (char *)in_stack_fffffffffffffba0);
      in_stack_fffffffffffffbb8 =
           ImGui_tryLoadFont(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                             (bool)in_stack_fffffffffffffde3);
      bVar10 = in_stack_fffffffffffffbb8 ^ 0xff;
    }
    local_243 = bVar10 & 1;
    if (bVar9) {
      std::__cxx11::string::~string(local_340);
      std::__cxx11::string::~string(local_360);
    }
    ImGui_SetStyle();
    SDL_EventState(0x1000,1);
    ImGui_NewFrame((SDL_Window *)local_118._M_unused._0_8_);
    ImGui::Render();
    std::thread::thread((thread *)0x172787);
    std::function<bool()>::operator=
              ((function<bool_()> *)
               CONCAT17(bVar2,CONCAT16(uVar1,CONCAT15(bVar15,CONCAT14(in_stack_fffffffffffffbc4,
                                                                      CONCAT13(bVar14,CONCAT12(
                                                  in_stack_fffffffffffffbc2,
                                                  CONCAT11(bVar13,in_stack_fffffffffffffbc0))))))),
               (anon_class_32_4_b1db6b8a *)
               CONCAT17(bVar4,CONCAT16(uVar3,CONCAT15(bVar12,CONCAT14(in_stack_fffffffffffffbbc,
                                                                      CONCAT13(bVar11,CONCAT12(
                                                  in_stack_fffffffffffffbba,
                                                  CONCAT11(bVar10,in_stack_fffffffffffffbb8))))))));
    this = &local_118;
    std::function<void(int,int)>::operator=
              ((function<void_(int,_int)> *)
               CONCAT17(bVar2,CONCAT16(uVar1,CONCAT15(bVar15,CONCAT14(in_stack_fffffffffffffbc4,
                                                                      CONCAT13(bVar14,CONCAT12(
                                                  in_stack_fffffffffffffbc2,
                                                  CONCAT11(bVar13,in_stack_fffffffffffffbc0))))))),
               (anon_class_8_1_722fcd2e *)
               CONCAT17(bVar4,CONCAT16(uVar3,CONCAT15(bVar12,CONCAT14(in_stack_fffffffffffffbbc,
                                                                      CONCAT13(bVar11,CONCAT12(
                                                  in_stack_fffffffffffffbba,
                                                  CONCAT11(bVar10,in_stack_fffffffffffffbb8))))))));
    std::function<bool()>::operator=
              ((function<bool_()> *)
               CONCAT17(bVar2,CONCAT16(uVar1,CONCAT15(bVar15,CONCAT14(in_stack_fffffffffffffbc4,
                                                                      CONCAT13(bVar14,CONCAT12(
                                                  in_stack_fffffffffffffbc2,
                                                  CONCAT11(bVar13,in_stack_fffffffffffffbc0))))))),
               (anon_class_16_2_9aebbfdd *)
               CONCAT17(bVar4,CONCAT16(uVar3,CONCAT15(bVar12,CONCAT14(in_stack_fffffffffffffbbc,
                                                                      CONCAT13(bVar11,CONCAT12(
                                                  in_stack_fffffffffffffbba,
                                                  CONCAT11(bVar10,in_stack_fffffffffffffbb8))))))));
    bVar9 = std::function<bool_()>::operator()((function<bool_()> *)this);
    if (bVar9) {
      do {
        bVar9 = std::function<bool_()>::operator()((function<bool_()> *)this);
      } while (bVar9);
      deinitMain();
      std::thread::join();
      GGWave_deinit();
      ImGui_Shutdown();
      ImGui::DestroyContext((ImGuiContext *)0x0);
      SDL_GL_DeleteContext(local_120);
      SDL_DestroyWindow(local_118._M_unused._M_object);
      SDL_CloseAudio();
      SDL_Quit();
      local_4 = 0;
    }
    else {
      printf("Error: failed to initialize audio\n");
      local_4 = -2;
    }
    local_f8 = 1;
    std::thread::~thread((thread *)0x172c67);
  }
  else {
    __stream = _stderr;
    uVar7 = SDL_GetError();
    fprintf(__stream,"Error: %s\n",uVar7);
    local_4 = -1;
    local_f8 = 1;
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x172c74);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
#ifdef __EMSCRIPTEN__
    printf("Build time: %s\n", BUILD_TIMESTAMP);
    printf("Press the Init button to start\n");

    if (argv[1]) {
        GGWave_setDefaultCaptureDeviceName(argv[1]);
    }
#endif

    auto argm = parseCmdArguments(argc, argv);
    int captureId = argm["c"].empty() ? 0 : std::stoi(argm["c"]);
    int playbackId = argm["p"].empty() ? 0 : std::stoi(argm["p"]);

    if (SDL_Init(SDL_INIT_VIDEO) != 0) {
        fprintf(stderr, "Error: %s\n", SDL_GetError());
        return -1;
    }

    ImGui_PreInit();

    int windowX = 400;
    int windowY = 600;

    // Waver video settings
    //float scale = 0.65;

    //int windowX = scale*570;
    //int windowY = scale*917;

    const char * windowTitle = "Waver";

#ifdef __EMSCRIPTEN__
    SDL_Renderer * renderer;
    SDL_Window * window;
    SDL_CreateWindowAndRenderer(windowX, windowY, SDL_WINDOW_OPENGL, &window, &renderer);
#else
    SDL_WindowFlags window_flags = (SDL_WindowFlags)(SDL_WINDOW_OPENGL | SDL_WINDOW_RESIZABLE | SDL_WINDOW_ALLOW_HIGHDPI);
    SDL_Window * window = SDL_CreateWindow(windowTitle, SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED, windowX, windowY, window_flags);
#endif

    void * gl_context = SDL_GL_CreateContext(window);

    SDL_GL_MakeCurrent(window, gl_context);
    SDL_GL_SetSwapInterval(1); // Enable vsync

    ImGui_Init(window, gl_context);
    ImGui::GetIO().IniFilename = nullptr;

    {
        bool isNotLoaded = true;
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "DroidSans.ttf", kGlobalImGuiScale*14.0f, false);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../bin/DroidSans.ttf", kGlobalImGuiScale*14.0f, false);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../examples/assets/fonts/DroidSans.ttf", kGlobalImGuiScale*14.0f, false);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../../examples/assets/fonts/DroidSans.ttf", kGlobalImGuiScale*14.0f, false);
    }

    {
        bool isNotLoaded = true;
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "fontawesome-webfont.ttf", kGlobalImGuiScale*14.0f, true);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../bin/fontawesome-webfont.ttf", kGlobalImGuiScale*14.0f, true);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../examples/assets/fonts/fontawesome-webfont.ttf", kGlobalImGuiScale*14.0f, true);
        isNotLoaded = isNotLoaded && !ImGui_tryLoadFont(getBinaryPath() + "../../examples/assets/fonts/fontawesome-webfont.ttf", kGlobalImGuiScale*14.0f, true);
    }

    ImGui_SetStyle();

    SDL_EventState(SDL_DROPFILE, SDL_ENABLE);

    ImGui_NewFrame(window);
    ImGui::Render();

    // tmp
    //addFile("test0.raw", "test0.raw", std::vector<char>(1024));
    //addFile("test1.jpg", "test0.jpg", std::vector<char>(1024*1024 + 624));
    //addFile("test2.mpv", "test0.mov", std::vector<char>(1024*1024*234 + 53827));

    bool isInitialized = false;
    std::thread worker;

    g_doInit = [&]() {
        if (GGWave_init(playbackId, captureId) == false) {
            fprintf(stderr, "Failed to initialize GGWave\n");
            return false;
        }

#ifdef __EMSCRIPTEN__
        initMain();
#else
        worker = initMainAndRunCore();
#endif

        isInitialized = true;

        return true;
    };

    g_setWindowSize = [&](int sizeX, int sizeY) {
        SDL_SetWindowSize(window, sizeX, sizeY);
    };

    g_mainUpdate = [&]() {
        if (isInitialized == false) {
            return true;
        }

        if (ImGui_BeginFrame(window) == false) {
            return false;
        }

        renderMain();
        updateMain();

        ImGui_EndFrame(window);

#ifdef __EMSCRIPTEN__
        updateCore();
#endif

        return true;
    };

#ifdef __EMSCRIPTEN__
    emscripten_set_main_loop_arg(mainUpdate, NULL, 60, true);
#else
    if (g_doInit() == false) {
        printf("Error: failed to initialize audio\n");
        return -2;
    }

    while (true) {
        if (g_mainUpdate() == false) break;
    }

    deinitMain();
    worker.join();

    GGWave_deinit();

    // Cleanup
    ImGui_Shutdown();
    ImGui::DestroyContext();

    SDL_GL_DeleteContext(gl_context);
    SDL_DestroyWindow(window);
    SDL_CloseAudio();
    SDL_Quit();
#endif

    return 0;
}